

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O2

ChCoordsys<double> * __thiscall
chrono::ChCoordsys<double>::TransformLocalToParent
          (ChCoordsys<double> *__return_storage_ptr__,ChCoordsys<double> *this,
          ChCoordsys<double> *local)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 local_68 [16];
  double local_58;
  ChQuaternion<double> local_48;
  
  TransformLocalToParent((ChVector<double> *)local_68,this,&local->pos);
  ChQuaternion<double>::operator%(&local_48,&this->rot,&local->rot);
  auVar1._8_8_ = local_58;
  auVar1._0_8_ = local_58;
  auVar1._16_8_ = local_58;
  auVar1._24_8_ = local_58;
  auVar1 = vblendps_avx(ZEXT1632(local_68),auVar1,0x30);
  auVar2._8_8_ = local_48.m_data[0];
  auVar2._0_8_ = local_48.m_data[0];
  auVar2._16_8_ = local_48.m_data[0];
  auVar2._24_8_ = local_48.m_data[0];
  auVar1 = vblendps_avx(auVar1,auVar2,0xc0);
  __return_storage_ptr__->pos = (ChVector<double>)auVar1._0_24_;
  (__return_storage_ptr__->rot).m_data[0] = (double)auVar1._24_8_;
  (__return_storage_ptr__->rot).m_data[1] = local_48.m_data[1];
  (__return_storage_ptr__->rot).m_data[2] = local_48.m_data[2];
  (__return_storage_ptr__->rot).m_data[3] = local_48.m_data[3];
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<Real> TransformLocalToParent(const ChCoordsys<Real>& local) const {
        return ChCoordsys<Real>(TransformLocalToParent(local.pos), rot % local.rot);
    }